

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

bool __thiscall
duckdb::PipelineExecutor::TryFlushCachingOperators
          (PipelineExecutor *this,ExecutionBudget *chunk_budget)

{
  Pipeline *pPVar1;
  PhysicalOperator *op;
  OperatorResultType value;
  int iVar2;
  reference pvVar3;
  reference this_00;
  optional_ptr<duckdb::DataChunk,_true> chunk;
  type pGVar4;
  reference this_01;
  type pOVar5;
  InternalException *this_02;
  ulong uVar6;
  size_type __n;
  PhysicalOperator *op_00;
  bool bVar7;
  bool local_90;
  allocator local_89;
  vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
  *local_88;
  PhysicalOperator *local_80;
  vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
  *local_78;
  string local_70;
  string local_50;
  
  if (this->started_flushing == false) {
    this->started_flushing = true;
    uVar6 = 0;
    if (0 < this->finished_processing_idx) {
      uVar6 = (ulong)(uint)this->finished_processing_idx;
    }
    this->flushing_idx = uVar6;
  }
  local_78 = &this->intermediate_chunks;
  local_80 = (PhysicalOperator *)&this->context;
  local_88 = &this->intermediate_states;
switchD_014ab486_caseD_0:
  do {
    pPVar1 = this->pipeline;
    if ((ulong)((long)(pPVar1->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar1->operators).
                      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= this->flushing_idx) {
      return true;
    }
    pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                       (&pPVar1->operators,this->flushing_idx);
    iVar2 = (*pvVar3->_M_data->_vptr_PhysicalOperator[0xd])();
    if ((char)iVar2 != '\0') {
      if ((this->should_flush_current_idx != false) ||
         ((this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur !=
          (this->in_process_operators).c.
          super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur)) {
        __n = this->flushing_idx;
        chunk.ptr = &this->final_chunk;
        if (__n + 1 < (ulong)((long)(this->intermediate_chunks).
                                    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->intermediate_chunks).
                                    super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          this_00 = vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_true>
                    ::get<true>(local_78,__n + 1);
          chunk.ptr = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                      operator*(this_00);
          __n = this->flushing_idx;
        }
        pvVar3 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                           (&this->pipeline->operators,__n);
        local_90 = true;
        bVar7 = true;
        if ((this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->in_process_operators).c.
            super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur) {
          op = pvVar3->_M_data;
          DataChunk::Reset(chunk.ptr);
          StartOperator(this,op);
          pGVar4 = unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>,_true>
                   ::operator*(&op->op_state);
          this_01 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                    ::get<true>(local_88,this->flushing_idx);
          pOVar5 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                   ::operator*(this_01);
          op_00 = local_80;
          iVar2 = (*op->_vptr_PhysicalOperator[0xb])(op,local_80,chunk.ptr,pGVar4,pOVar5);
          EndOperator(this,op_00,chunk);
          bVar7 = (char)iVar2 == '\0';
        }
        value = ExecutePushInternal(this,chunk.ptr,chunk_budget,this->flushing_idx + 1);
        this->should_flush_current_idx = bVar7;
        switch(value) {
        case NEED_MORE_INPUT:
          goto switchD_014ab486_caseD_0;
        case BLOCKED:
          this->remaining_sink_chunk = true;
        case HAVE_MORE_OUTPUT:
          local_90 = false;
        case FINISHED:
          return local_90;
        default:
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     "Unexpected OperatorResultType (%s) in TryFlushCachingOperators",&local_89);
          EnumUtil::ToString<duckdb::OperatorResultType>(&local_70,value);
          InternalException::InternalException<std::__cxx11::string>(this_02,&local_50,&local_70);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      this->should_flush_current_idx = true;
    }
    this->flushing_idx = this->flushing_idx + 1;
  } while( true );
}

Assistant:

bool PipelineExecutor::TryFlushCachingOperators(ExecutionBudget &chunk_budget) {
	if (!started_flushing) {
		// Remainder of this method assumes any in process operators are from flushing
		D_ASSERT(in_process_operators.empty());
		started_flushing = true;
		flushing_idx = IsFinished() ? idx_t(finished_processing_idx) : 0;
	}

	// For each operator that supports FinalExecute,
	// extract every chunk from it and push it through the rest of the pipeline
	// before moving onto the next operators' FinalExecute
	while (flushing_idx < pipeline.operators.size()) {
		if (!pipeline.operators[flushing_idx].get().RequiresFinalExecute()) {
			flushing_idx++;
			continue;
		}

		// This slightly awkward way of increasing the flushing idx is to make the code re-entrant: We need to call this
		// method again in the case of a Sink returning BLOCKED.
		if (!should_flush_current_idx && in_process_operators.empty()) {
			should_flush_current_idx = true;
			flushing_idx++;
			continue;
		}

		auto &curr_chunk =
		    flushing_idx + 1 >= intermediate_chunks.size() ? final_chunk : *intermediate_chunks[flushing_idx + 1];
		auto &current_operator = pipeline.operators[flushing_idx].get();

		OperatorFinalizeResultType finalize_result;

		if (in_process_operators.empty()) {
			curr_chunk.Reset();
			StartOperator(current_operator);
			finalize_result = current_operator.FinalExecute(context, curr_chunk, *current_operator.op_state,
			                                                *intermediate_states[flushing_idx]);
			EndOperator(current_operator, &curr_chunk);
		} else {
			// Reset flag and reflush the last chunk we were flushing.
			finalize_result = OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		}

		auto push_result = ExecutePushInternal(curr_chunk, chunk_budget, flushing_idx + 1);

		if (finalize_result == OperatorFinalizeResultType::HAVE_MORE_OUTPUT) {
			should_flush_current_idx = true;
		} else {
			should_flush_current_idx = false;
		}

		switch (push_result) {
		case OperatorResultType::BLOCKED: {
			remaining_sink_chunk = true;
			return false;
		}
		case OperatorResultType::HAVE_MORE_OUTPUT: {
			D_ASSERT(chunk_budget.IsDepleted());
			// The chunk budget was used up, pushing the chunk through the pipeline created more chunks
			// we need to continue this the next time Execute is called.
			return false;
		}
		case OperatorResultType::NEED_MORE_INPUT:
			continue;
		case OperatorResultType::FINISHED:
			break;
		default:
			throw InternalException("Unexpected OperatorResultType (%s) in TryFlushCachingOperators",
			                        EnumUtil::ToString(push_result));
		}
		break;
	}
	return true;
}